

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BS_thread_pool.hpp
# Opt level: O0

void __thiscall
BS::blocks<unsigned_long>::blocks
          (blocks<unsigned_long> *this,unsigned_long first_index_,unsigned_long index_after_last_,
          size_t num_blocks_)

{
  unsigned_long *puVar1;
  ulong in_RCX;
  ulong in_RDX;
  ulong in_RSI;
  ulong *in_RDI;
  size_t total_size;
  ulong local_38;
  ulong local_28 [5];
  
  *in_RDI = 0;
  in_RDI[1] = in_RSI;
  in_RDI[2] = in_RDX;
  in_RDI[3] = in_RCX;
  in_RDI[4] = 0;
  if (in_RDI[1] < in_RDI[2]) {
    local_28[0] = in_RDI[2] - in_RDI[1];
    puVar1 = std::min<unsigned_long>(in_RDI + 3,local_28);
    in_RDI[3] = *puVar1;
    *in_RDI = local_28[0] / in_RDI[3];
    in_RDI[4] = local_28[0] % in_RDI[3];
    if (*in_RDI == 0) {
      *in_RDI = 1;
      if (local_28[0] < 2) {
        local_38 = 1;
      }
      else {
        local_38 = local_28[0];
      }
      in_RDI[3] = local_38;
    }
  }
  else {
    in_RDI[3] = 0;
  }
  return;
}

Assistant:

blocks(const T first_index_, const T index_after_last_, const std::size_t num_blocks_) noexcept : first_index(first_index_), index_after_last(index_after_last_), num_blocks(num_blocks_)
    {
        if (index_after_last > first_index)
        {
            const std::size_t total_size = static_cast<std::size_t>(index_after_last - first_index);
            num_blocks = std::min(num_blocks, total_size);
            block_size = total_size / num_blocks;
            remainder = total_size % num_blocks;
            if (block_size == 0)
            {
                block_size = 1;
                num_blocks = (total_size > 1) ? total_size : 1;
            }
        }
        else
        {
            num_blocks = 0;
        }
    }